

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMan.c
# Opt level: O3

int Aig_ManCoCleanup(Aig_Man_t *p)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  uint uVar6;
  long lVar7;
  Aig_Obj_t *pObj;
  
  iVar1 = p->nObjs[3];
  pVVar4 = p->vCos;
  uVar2 = pVVar4->nSize;
  uVar3 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar6 = 0;
  }
  else {
    lVar7 = 0;
    uVar6 = 0;
    do {
      ppvVar5 = pVVar4->pArray;
      pObj = (Aig_Obj_t *)ppvVar5[lVar7];
      if (((lVar7 < (long)p->nObjs[3] - (long)p->nRegs) &&
          ((*(uint *)(((ulong)pObj->pFanin0 & 0xfffffffffffffffe) + 0x18) & 7) == 1)) &&
         (((ulong)pObj->pFanin0 & 1) != 0)) {
        Aig_ObjDisconnect(p,pObj);
        uVar2 = pObj->Id;
        if (((int)uVar2 < 0) || (p->vObjs->nSize <= (int)uVar2)) {
LAB_006c6f6d:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        ppvVar5 = p->vObjs->pArray;
        pObj = (Aig_Obj_t *)0x0;
      }
      else {
        if (((int)uVar6 < 0) || ((uint)uVar3 <= uVar6)) goto LAB_006c6f6d;
        uVar2 = uVar6;
        uVar6 = uVar6 + 1;
      }
      ppvVar5[uVar2] = pObj;
      lVar7 = lVar7 + 1;
      pVVar4 = p->vCos;
      uVar2 = pVVar4->nSize;
      uVar3 = (ulong)(int)uVar2;
    } while (lVar7 < (long)uVar3);
  }
  if ((int)uVar2 < (int)uVar6) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
  }
  pVVar4->nSize = uVar6;
  p->nObjs[3] = uVar6;
  if (p->nRegs != 0) {
    p->nTruePos = uVar6 - p->nRegs;
  }
  return iVar1 - uVar6;
}

Assistant:

int Aig_ManCoCleanup( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, k = 0, nPosOld = Aig_ManCoNum(p);
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vCos, pObj, i )
    {
        if ( i >= Aig_ManCoNum(p) - Aig_ManRegNum(p) )
            Vec_PtrWriteEntry( p->vCos, k++, pObj );
        else if ( !Aig_ObjIsConst1(Aig_ObjFanin0(pObj)) || !Aig_ObjFaninC0(pObj) ) // non-const or const1
            Vec_PtrWriteEntry( p->vCos, k++, pObj );
        else
        {
            Aig_ObjDisconnect( p, pObj );
            Vec_PtrWriteEntry( p->vObjs, pObj->Id, NULL );
        }
    }
    Vec_PtrShrink( p->vCos, k );
    p->nObjs[AIG_OBJ_CO] = Vec_PtrSize( p->vCos );
    if ( Aig_ManRegNum(p) )
        p->nTruePos = Aig_ManCoNum(p) - Aig_ManRegNum(p);
    return nPosOld - Aig_ManCoNum(p);
}